

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

int mapEndSurfaceHeight(float *y,EndNoise *en,SurfaceNoise *sn,int x,int z,int w,int h,int scale,
                       int ymin)

{
  ulong uVar1;
  byte bVar2;
  int colymin;
  int iVar3;
  int iVar4;
  double *__ptr;
  double *pdVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  double *pdVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  double *pdVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  double dVar19;
  ulong uVar14;
  
  iVar3 = 1;
  if (((uint)scale < 9) && ((0x116U >> (scale & 0x1fU) & 1) != 0)) {
    iVar3 = 2;
    if (2 < ymin >> 2) {
      iVar3 = ymin >> 2;
    }
    colymin = 0x11;
    if (iVar3 < 0x11) {
      colymin = iVar3;
    }
    uVar13 = 0x13 - colymin;
    uVar14 = (ulong)uVar13;
    if ((uint)scale < 2) {
      dVar19 = 0.0;
    }
    else {
      dVar19 = (double)scale * 0.0625;
    }
    bVar2 = 8 / (byte)scale;
    uVar8 = (uint)bVar2;
    iVar11 = x / (int)uVar8 - (uint)(x % (int)uVar8 != 0 && x < 0);
    iVar3 = w + x + -1;
    uVar9 = (uint)bVar2;
    uVar17 = ((iVar3 / (int)uVar9 - iVar11) - (uint)(iVar3 % (int)uVar9 != 0 && w + x < 1)) + 2;
    __ptr = (double *)malloc(uVar14 * (long)(int)uVar17 * 0x10);
    pdVar10 = __ptr + (int)(uVar13 * uVar17);
    if (0 < (int)uVar17) {
      lVar7 = -(ulong)uVar17;
      pdVar15 = pdVar10;
      iVar3 = iVar11;
      do {
        sampleNoiseColumnEnd
                  (pdVar15,sn,en,iVar3,z / (int)uVar8 - (uint)(z < 0 && z % (int)uVar8 != 0),colymin
                   ,0x12);
        iVar3 = iVar3 + 1;
        pdVar15 = pdVar15 + uVar14;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
    }
    if (0 < h) {
      uVar12 = 0;
      pdVar15 = __ptr;
      do {
        uVar16 = uVar12 + (long)z;
        uVar1 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
        iVar3 = (int)((long)uVar1 / (long)(int)uVar9) -
                (uint)((int)((long)uVar1 % (long)(int)uVar9) != 0 && (long)uVar16 < 0);
        iVar18 = (int)uVar16 - iVar3 * uVar9;
        pdVar5 = pdVar15;
        if ((uVar12 == 0 || iVar18 == 0) && (pdVar5 = pdVar10, pdVar10 = pdVar15, 0 < (int)uVar17))
        {
          lVar7 = -(ulong)uVar17;
          iVar6 = iVar11;
          do {
            sampleNoiseColumnEnd(pdVar15,sn,en,iVar6,iVar3 + 1,colymin,0x12);
            iVar6 = iVar6 + 1;
            pdVar15 = pdVar15 + uVar14;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0);
        }
        if (0 < w) {
          uVar16 = 0;
          iVar3 = x;
          do {
            iVar6 = iVar3 / (int)uVar9 -
                    (uint)(iVar3 % (int)uVar9 != 0 && (long)((long)x + uVar16) < 0);
            iVar4 = (iVar6 - iVar11) * uVar13;
            iVar6 = getSurfaceHeight(pdVar5 + iVar4,pdVar10 + iVar4,pdVar5 + iVar4 + uVar14,
                                     pdVar10 + iVar4 + uVar14,colymin,0x12,4,
                                     (double)(int)(((int)uVar16 + x) - iVar6 * uVar9) /
                                     (double)(int)(char)bVar2 + dVar19,
                                     (double)iVar18 / (double)(int)(char)bVar2 + dVar19);
            y[uVar16] = (float)iVar6;
            uVar16 = uVar16 + 1;
            iVar3 = iVar3 + 1;
          } while ((uint)w != uVar16);
        }
        uVar12 = uVar12 + 1;
        y = y + (uint)w;
        pdVar15 = pdVar5;
      } while (uVar12 != (uint)h);
    }
    free(__ptr);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mapEndSurfaceHeight(float *y, const EndNoise *en, const SurfaceNoise *sn,
    int x, int z, int w, int h, int scale, int ymin)
{
    if (scale != 1 && scale != 2 && scale != 4 && scale != 8)
        return 1;

    int y0 = ymin >> 2;
    if (y0 <  2) y0 =  2;
    if (y0 > 17) y0 = 17;
    int y1 = 18;
    int yn = y1 - y0 + 1;
    double cellmid = scale > 1 ? scale / 16.0 : 0;
    int cellsiz = 8 / scale;
    int cx = floordiv(x, cellsiz);
    int cz = floordiv(z, cellsiz);
    int cw = floordiv(x + w - 1, cellsiz) - cx + 2;
    int i, j;

    double *buf = malloc(sizeof(double) * yn * cw * 2);
    double *ncol[2];
    ncol[0] = buf;
    ncol[1] = buf + yn * cw;

    for (i = 0; i < cw; i++)
        sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cz+0, y0, y1);

    for (j = 0; j < h; j++)
    {
        int cj = floordiv(z + j, cellsiz);
        int dj = z + j - cj * cellsiz;
        if (j == 0 || dj == 0)
        {
            double *tmp = ncol[0];
            ncol[0] = ncol[1];
            ncol[1] = tmp;
            for (i = 0; i < cw; i++)
                sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cj+1, y0, y1);
        }

        for (i = 0; i < w; i++)
        {
            int ci = floordiv(x + i, cellsiz);
            int di = x + i - ci * cellsiz;
            double dx = di / (double) cellsiz + cellmid;
            double dz = dj / (double) cellsiz + cellmid;
            double *ncol0 = ncol[0] + (ci - cx) * yn;
            double *ncol1 = ncol[1] + (ci - cx) * yn;
            y[j*w+i] = getSurfaceHeight(ncol0, ncol1, ncol0+yn, ncol1+yn,
                y0, y1, 4, dx, dz);
        }
    }

    free(buf);
    return 0;
}